

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

void Jf_ObjComputeCuts(Jf_Man_t *p,Gia_Obj_t *pObj,int fEdge)

{
  word *pwVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  word **ppwVar5;
  word *pwVar6;
  word *pwVar7;
  ulong *puVar8;
  ulong *puVar9;
  Jf_Par_t *pJVar10;
  Vec_Int_t *p_00;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  undefined8 uVar16;
  byte bVar17;
  int nLits;
  int iVar18;
  uint uVar19;
  undefined1 *puVar20;
  uint *puVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  uint *puVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  int nLits_1;
  long lVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  uint *pCut0;
  Jf_Cut_t *pJVar38;
  int iVar39;
  long lVar40;
  bool bVar41;
  float fVar42;
  Jf_Cut_t *pSto [18];
  word Sign1 [18];
  word Sign0 [18];
  Jf_Cut_t Sto [18];
  long local_6a8;
  ulong local_670 [19];
  ulong auStack_5d8 [18];
  ulong auStack_548 [18];
  undefined1 local_4b8 [1160];
  
  pGVar3 = p->pGia->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->pGia->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar23 = p->pPars->nLutSize;
  uVar19 = p->pPars->nCutNum;
  iVar15 = (int)((long)pObj - (long)pGVar3 >> 2);
  uVar12 = iVar15 * -0x55555555;
  if (-2 < (int)uVar19) {
    puVar20 = local_4b8;
    uVar32 = 0;
    do {
      local_670[uVar32 + 1] = (ulong)puVar20;
      *(undefined8 *)(puVar20 + 0x10) = 0xffffffff;
      uVar32 = uVar32 + 1;
      puVar20 = puVar20 + 0x40;
    } while (uVar19 + 2 != uVar32);
  }
  uVar16 = *(undefined8 *)pObj;
  uVar13 = uVar12 - ((uint)uVar16 & 0x1fffffff);
  if (((int)uVar13 < 0) || (iVar18 = (p->vCuts).nSize, iVar18 <= (int)uVar13)) goto LAB_0075c136;
  piVar4 = (p->vCuts).pArray;
  uVar13 = piVar4[uVar13];
  ppwVar5 = (p->pMem).pPages;
  bVar17 = (byte)(p->pMem).nPageSize;
  pwVar6 = ppwVar5[(int)uVar13 >> (bVar17 & 0x1f)];
  uVar35 = (p->pMem).uPageMask;
  uVar13 = uVar13 & uVar35;
  pwVar1 = pwVar6 + (int)uVar13;
  pCut0 = (uint *)((long)pwVar1 + 4);
  iVar39 = (int)*pwVar1;
  uVar32 = (ulong)iVar39;
  if (0 < (long)uVar32) {
    uVar26 = 0;
    puVar21 = pCut0;
    do {
      uVar22 = *puVar21;
      if ((uVar22 & 0xf) == 0) {
        lVar40 = 1;
        uVar28 = 0;
      }
      else {
        lVar40 = ((ulong)uVar22 & 0xf) + 1;
        uVar24 = 0;
        uVar28 = 0;
        do {
          if ((int)puVar21[uVar24 + 1] < 0) goto LAB_0075c0f8;
          uVar28 = uVar28 | 1L << ((ulong)(byte)((byte)puVar21[uVar24 + 1] >> 1) & 0x3f);
          uVar24 = uVar24 + 1;
        } while ((uVar22 & 0xf) != uVar24);
      }
      auStack_548[uVar26] = uVar28;
      uVar26 = uVar26 + 1;
      puVar21 = puVar21 + lVar40;
    } while (uVar26 != uVar32);
  }
  uVar22 = uVar12 - ((uint)((ulong)uVar16 >> 0x20) & 0x1fffffff);
  if (((int)uVar22 < 0) || (iVar18 <= (int)uVar22)) goto LAB_0075c136;
  uVar22 = piVar4[uVar22];
  uVar35 = uVar35 & uVar22;
  pwVar7 = ppwVar5[(int)uVar22 >> (bVar17 & 0x1f)];
  pwVar1 = pwVar7 + (int)uVar35;
  puVar21 = (uint *)((long)pwVar1 + 4);
  iVar18 = (int)*pwVar1;
  lVar40 = (long)iVar18;
  if (0 < lVar40) {
    lVar33 = 0;
    puVar29 = puVar21;
    do {
      uVar22 = *puVar29;
      if ((uVar22 & 0xf) == 0) {
        lVar36 = 1;
        uVar26 = 0;
      }
      else {
        lVar36 = ((ulong)uVar22 & 0xf) + 1;
        uVar28 = 0;
        uVar26 = 0;
        do {
          if ((int)puVar29[uVar28 + 1] < 0) goto LAB_0075c0f8;
          uVar26 = uVar26 | 1L << ((ulong)(byte)((byte)puVar29[uVar28 + 1] >> 1) & 0x3f);
          uVar28 = uVar28 + 1;
        } while ((uVar22 & 0xf) != uVar28);
      }
      auStack_5d8[lVar33] = uVar26;
      lVar33 = lVar33 + 1;
      puVar29 = puVar29 + lVar36;
    } while (lVar33 != lVar40);
  }
  p->CutCount[0] = p->CutCount[0] + (long)(iVar18 * iVar39);
  if (iVar39 < 1) {
    uVar16 = *(undefined8 *)pObj;
    uVar26 = 0;
    iVar18 = 0;
    if (((uint)uVar16 >> 0x1e & 1) != 0) {
LAB_0075be0b:
      if (((pObj[-(ulong)((uint)uVar16 & 0x1fffffff)].field_0x3 & 0x40) != 0) ||
         ((pObj[-(ulong)((uint)((ulong)uVar16 >> 0x20) & 0x1fffffff)].field_0x3 & 0x40) != 0)) {
        __assert_fail("Jf_ObjIsUnit(Gia_ObjFanin0(pObj)) && Jf_ObjIsUnit(Gia_ObjFanin1(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                      ,0x4b2,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
      }
      uVar32 = local_670[(long)iVar18 + 1];
      if (p->pPars->fCutMin != 0) {
        *(undefined4 *)(uVar32 + 0x10) = 4;
      }
      *(undefined4 *)(uVar32 + 0x18) = 2;
      iVar23 = uVar12 - (*(uint *)pObj & 0x1fffffff);
      if (iVar23 < 0) goto LAB_0075c263;
      *(uint *)(uVar32 + 0x1c) = (*(uint *)pObj >> 0x1d & 1) + iVar23 * 2;
      uVar19 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
      iVar23 = uVar12 - (uVar19 & 0x1fffffff);
      if (iVar23 < 0) goto LAB_0075c263;
      *(uint *)(uVar32 + 0x20) = (uVar19 >> 0x1d & 1) + iVar23 * 2;
      uVar26 = (ulong)(iVar18 + 1);
      uVar16 = *(undefined8 *)pObj;
    }
  }
  else {
    local_6a8 = 0;
    uVar26 = 0;
    do {
      if (0 < (int)lVar40) {
        local_670[0] = auStack_548[local_6a8];
        lVar33 = 0;
        puVar29 = puVar21;
        uVar32 = uVar26;
        do {
          uVar24 = auStack_5d8[lVar33] | local_670[0];
          uVar26 = uVar24 - (uVar24 >> 1 & 0x5555555555555555);
          uVar28 = (uVar26 >> 2 & 0x3333333333333333) + (uVar26 & 0x3333333333333333);
          uVar26 = uVar32;
          if ((int)(uint)(byte)(((uVar28 >> 4) + uVar28 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) <= iVar23) {
            p->CutCount[1] = p->CutCount[1] + 1;
            uVar22 = (uint)uVar32;
            lVar40 = (long)(int)uVar22;
            if (p->pPars->fCutMin == 0) {
              pJVar38 = (Jf_Cut_t *)local_670[(long)(int)uVar22 + 1];
              iVar18 = Jf_CutMergeOrder((int *)pCut0,(int *)puVar29,pJVar38->pCut,iVar23);
              if (iVar18 != 0) {
                pJVar38->Sign = uVar24;
LAB_0075b87c:
                p->CutCount[2] = p->CutCount[2] + 1;
                iVar18 = 0;
                uVar14 = pJVar38->pCut[0];
                if (p->pPars->fAreaOnly == 0) {
                  if ((uVar14 & 0xf) != 0) {
                    uVar26 = 0;
                    iVar18 = 0;
                    do {
                      if (pJVar38->pCut[uVar26 + 1] < 0) goto LAB_0075c0f8;
                      uVar31 = (uint)pJVar38->pCut[uVar26 + 1] >> 1;
                      if ((p->vArr).nSize <= (int)uVar31) goto LAB_0075c136;
                      iVar39 = (p->vArr).pArray[uVar31];
                      if (iVar18 <= iVar39) {
                        iVar18 = iVar39;
                      }
                      uVar26 = uVar26 + 1;
                    } while ((uVar14 & 0xf) != uVar26);
                    iVar18 = iVar18 + 1;
                    goto LAB_0075b8da;
                  }
                  pJVar38->Time = 1;
LAB_0075b92f:
                  fVar42 = 0.0;
                }
                else {
LAB_0075b8da:
                  pJVar38->Time = iVar18;
                  if ((uVar14 & 0xf) == 0) goto LAB_0075b92f;
                  fVar42 = 0.0;
                  uVar26 = 0;
                  do {
                    if (pJVar38->pCut[uVar26 + 1] < 0) goto LAB_0075c0f8;
                    uVar31 = (uint)pJVar38->pCut[uVar26 + 1] >> 1;
                    if ((p->vFlow).nSize <= (int)uVar31) goto LAB_0075c117;
                    fVar42 = fVar42 + (p->vFlow).pArray[uVar31];
                    uVar26 = uVar26 + 1;
                  } while ((uVar14 & 0xf) != uVar26);
                  if (fVar42 < 0.0) {
                    __assert_fail("Flow >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                  ,0x21b,"float Jf_CutFlow(Jf_Man_t *, int *)");
                  }
                }
                pJVar38->Flow = fVar42;
                if (uVar22 == 0) {
                  uVar22 = 1;
                }
                else {
                  if ((uVar22 == uVar19) &&
                     (fVar42 = (*p->pCutCmp)((Jf_Cut_t *)local_670[lVar40],pJVar38),
                     uVar26 = (ulong)uVar19, fVar42 <= 0.0)) goto LAB_0075bd61;
                  if ((int)uVar19 < (int)uVar22) {
                    __assert_fail("c <= cMax",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                  ,0x3c9,
                                  "int Jf_ObjAddCutToStore(Jf_Man_t *, Jf_Cut_t **, int, int)");
                  }
                  pJVar38 = (Jf_Cut_t *)local_670[lVar40 + 1];
                  uVar14 = uVar22 + 1;
                  do {
                    uVar31 = (int)uVar22 >> 0x1f & uVar22;
                    if ((int)uVar32 < 1) break;
                    puVar8 = local_670 + uVar32;
                    uVar32 = uVar32 - 1;
                    fVar42 = (*p->pCutCmp)((Jf_Cut_t *)*puVar8,pJVar38);
                    uVar14 = uVar14 - 1;
                    uVar31 = uVar14;
                  } while (0.0 <= fVar42);
                  iVar18 = p->pPars->fCutMin;
                  if (iVar18 == 0) {
                    if (0 < (int)uVar31) {
                      uVar14 = pJVar38->pCut[0] & 0xf;
                      uVar32 = 0;
                      do {
                        puVar8 = (ulong *)local_670[uVar32 + 1];
                        if (((int)(uint)puVar8[3] <= pJVar38->pCut[0]) &&
                           ((*puVar8 & ~pJVar38->Sign) == 0)) {
                          uVar27 = (uint)puVar8[3] & 0xf;
                          if (uVar14 == uVar27) {
                            if (uVar14 == 0) goto LAB_0075bd54;
                            uVar26 = 0;
                            while (pJVar38->pCut[uVar26 + 1] ==
                                   *(int *)((long)puVar8 + uVar26 * 4 + 0x1c)) {
                              uVar26 = uVar26 + 1;
                              if (uVar14 == uVar26) goto LAB_0075bd54;
                            }
                          }
                          else {
                            if (uVar14 <= uVar27) goto LAB_0075c1e7;
                            uVar34 = 1;
                            uVar26 = 0;
                            do {
                              iVar39 = *(int *)((long)puVar8 + (long)(int)uVar34 * 4 + 0x18);
                              if (iVar39 < pJVar38->pCut[uVar26 + 1]) break;
                              if (pJVar38->pCut[uVar26 + 1] == iVar39) {
                                if (uVar34 == uVar27) goto LAB_0075bd54;
                                uVar34 = uVar34 + 1;
                              }
                              uVar26 = uVar26 + 1;
                            } while (uVar14 != uVar26);
                          }
                        }
                        uVar32 = uVar32 + 1;
                      } while (uVar32 != uVar31);
                    }
                  }
                  else if (0 < (int)uVar31) {
                    uVar14 = pJVar38->pCut[0];
                    uVar27 = uVar14 & 0xf;
                    uVar32 = 0;
                    do {
                      puVar8 = (ulong *)local_670[uVar32 + 1];
                      uVar34 = (uint)puVar8[3];
                      if (((int)uVar34 <= (int)uVar14) && ((*puVar8 & ~pJVar38->Sign) == 0)) {
                        if ((uVar34 & 0xf) != 0) {
                          lVar36 = 1;
                          do {
                            uVar30 = *(uint *)((long)puVar8 + lVar36 * 4 + 0x18);
                            if ((int)uVar30 < 0) goto LAB_0075c0f8;
                            if (uVar27 == 0) {
                              iVar39 = 1;
                            }
                            else {
                              uVar26 = 0;
                              do {
                                if (pJVar38->pCut[uVar26 + 1] < 0) goto LAB_0075c0f8;
                                if ((pJVar38->pCut[uVar26 + 1] ^ uVar30) < 2) {
                                  uVar11 = (uint)uVar26;
                                  break;
                                }
                                uVar26 = uVar26 + 1;
                                uVar11 = uVar27;
                              } while (uVar27 != uVar26);
                              iVar39 = uVar11 + 1;
                            }
                            if ((int)uVar14 < iVar39) goto LAB_0075ba84;
                            lVar36 = lVar36 + 1;
                            if (lVar36 == ((ulong)uVar34 & 0xf) + 1) break;
                          } while( true );
                        }
                        goto LAB_0075bd54;
                      }
LAB_0075ba84:
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != uVar31);
                  }
                  lVar36 = (long)(int)uVar31;
                  if ((int)uVar31 < (int)uVar22) {
                    do {
                      local_670[lVar40 + 1] = local_670[lVar40];
                      lVar40 = lVar40 + -1;
                    } while (lVar36 < lVar40);
                    iVar39 = uVar31 + 1;
                    lVar40 = lVar36 + 1;
                    local_670[lVar36 + 1] = (ulong)pJVar38;
                    if (iVar18 == 0) {
                      do {
                        puVar8 = (ulong *)local_670[lVar36 + 1];
                        puVar9 = (ulong *)local_670[lVar40 + 1];
                        if (((int)(uint)puVar9[3] < (int)(uint)puVar8[3]) ||
                           ((*puVar8 & ~*puVar9) != 0)) {
LAB_0075bce8:
                          iVar18 = iVar39 + 1;
                          if (iVar39 != (int)lVar40) {
                            uVar32 = local_670[(long)iVar39 + 1];
                            local_670[(long)iVar39 + 1] = (ulong)puVar9;
                            local_670[lVar40 + 1] = uVar32;
                          }
                        }
                        else {
                          uVar14 = (uint)puVar9[3] & 0xf;
                          uVar31 = (uint)puVar8[3] & 0xf;
                          iVar18 = iVar39;
                          if (uVar14 != uVar31) {
                            if (uVar14 <= uVar31) {
LAB_0075c1e7:
                              __assert_fail("nSizeB > nSizeC",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                            ,0x236,"int Jf_CutIsContainedOrder(int *, int *)");
                            }
                            uVar27 = 1;
                            uVar32 = 0;
                            do {
                              iVar25 = *(int *)((long)puVar8 + (long)(int)uVar27 * 4 + 0x18);
                              iVar2 = *(int *)((long)puVar9 + uVar32 * 4 + 0x1c);
                              if (iVar25 < iVar2) break;
                              if (iVar2 == iVar25) {
                                if (uVar27 == uVar31) goto LAB_0075bd0c;
                                uVar27 = uVar27 + 1;
                              }
                              uVar32 = uVar32 + 1;
                            } while (uVar14 != uVar32);
                            goto LAB_0075bce8;
                          }
                          if (uVar14 != 0) {
                            uVar32 = 0;
                            do {
                              if (*(int *)((long)puVar9 + uVar32 * 4 + 0x1c) !=
                                  *(int *)((long)puVar8 + uVar32 * 4 + 0x1c)) goto LAB_0075bce8;
                              uVar32 = uVar32 + 1;
                            } while (uVar14 != uVar32);
                          }
                        }
LAB_0075bd0c:
                        iVar39 = iVar18;
                        lVar40 = lVar40 + 1;
                      } while (uVar22 + 1 != (int)lVar40);
                    }
                    else {
                      do {
                        puVar8 = (ulong *)local_670[lVar36 + 1];
                        uVar14 = (uint)puVar8[3];
                        puVar9 = (ulong *)local_670[lVar40 + 1];
                        uVar31 = (uint)puVar9[3];
                        if (((int)uVar31 < (int)uVar14) || ((*puVar8 & ~*puVar9) != 0)) {
LAB_0075bc29:
                          iVar18 = iVar39 + 1;
                          if (iVar39 != (int)lVar40) {
                            uVar32 = local_670[(long)iVar39 + 1];
                            local_670[(long)iVar39 + 1] = (ulong)puVar9;
                            local_670[lVar40 + 1] = uVar32;
                          }
                        }
                        else {
                          iVar18 = iVar39;
                          if ((uVar14 & 0xf) != 0) {
                            uVar27 = uVar31 & 0xf;
                            lVar37 = 1;
                            do {
                              uVar34 = *(uint *)((long)puVar8 + lVar37 * 4 + 0x18);
                              if ((int)uVar34 < 0) goto LAB_0075c0f8;
                              if (uVar27 == 0) {
                                iVar25 = 1;
                              }
                              else {
                                uVar32 = 0;
                                do {
                                  uVar30 = *(uint *)((long)puVar9 + uVar32 * 4 + 0x1c);
                                  if ((int)uVar30 < 0) goto LAB_0075c0f8;
                                  if ((uVar30 ^ uVar34) < 2) {
                                    uVar30 = (uint)uVar32;
                                    break;
                                  }
                                  uVar32 = uVar32 + 1;
                                  uVar30 = uVar27;
                                } while (uVar27 != uVar32);
                                iVar25 = uVar30 + 1;
                              }
                              if ((int)uVar31 < iVar25) goto LAB_0075bc29;
                              lVar37 = lVar37 + 1;
                            } while (lVar37 != ((ulong)uVar14 & 0xf) + 1);
                          }
                        }
                        iVar39 = iVar18;
                        lVar40 = lVar40 + 1;
                      } while (uVar22 + 1 != (int)lVar40);
                    }
                  }
                  else {
                    local_670[lVar36 + 1] = (ulong)pJVar38;
                    iVar39 = uVar31 + 1;
                  }
                  uVar22 = iVar39 - (uint)(iVar39 == uVar19 + 1);
                }
LAB_0075bd54:
                uVar26 = (ulong)uVar22;
                if ((int)uVar19 < (int)uVar22) {
                  __assert_fail("c <= CutNum",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                ,0x4ab,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
                }
              }
            }
            else {
              pJVar38 = (Jf_Cut_t *)local_670[lVar40 + 1];
              piVar4 = pJVar38->pCut;
              if (p->pPars->fFuncDsd == 0) {
                iVar18 = Jf_CutMergeOrder((int *)pCut0,(int *)puVar29,piVar4,iVar23);
                if (iVar18 != 0) {
                  pJVar38->Sign = uVar24;
                  iVar18 = pJVar38->pCut[0];
                  uVar31 = Jf_TtComputeForCut(p,(uint)(*(ulong *)pObj >> 0x1d) & 1 ^ *pCut0 >> 8,
                                              (uint)(*(ulong *)pObj >> 0x3d) & 1 ^ *puVar29 >> 8,
                                              (int *)pCut0,(int *)puVar29,piVar4);
                  pJVar38->iFunc = uVar31;
                  uVar14 = pJVar38->pCut[0];
                  if (iVar18 < (int)uVar14) {
                    __assert_fail("pSto[c]->pCut[0] <= nOldSupp",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                  ,0x4a1,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
                  }
                  if ((int)uVar14 < iVar18) {
                    if ((uVar14 & 0xf) == 0) {
                      uVar26 = 0;
                    }
                    else {
                      uVar28 = 0;
                      uVar26 = 0;
                      do {
                        if (pJVar38->pCut[uVar28 + 1] < 0) goto LAB_0075c0f8;
                        uVar26 = uVar26 | 1L << ((ulong)((uint)pJVar38->pCut[uVar28 + 1] >> 1 & 0x7f
                                                        ) & 0x3f);
                        uVar28 = uVar28 + 1;
                      } while ((uVar14 & 0xf) != uVar28);
                    }
                    pJVar38->Sign = uVar26;
                  }
                  if (0xffffff < uVar31) {
                    puts(
                        "Hard limit on the number of different Boolean functions (2^23) is reached. Quitting..."
                        );
                    exit(1);
                  }
                  goto LAB_0075b87c;
                }
              }
              else {
                uVar31 = *pCut0 & 0xf;
                uVar14 = *puVar29;
                *piVar4 = uVar31;
                if ((uVar14 & 0xf) == 0) {
                  memcpy(pJVar38->pCut + 1,pCut0 + 1,(ulong)(uVar31 << 2));
                  uVar27 = 0x3ffff;
                }
                else {
                  lVar36 = 1;
                  uVar27 = 0x3ffff;
                  do {
                    uVar34 = uVar27;
                    uVar27 = puVar29[lVar36];
                    if ((int)uVar27 < 0) goto LAB_0075c0f8;
                    uVar30 = *pCut0 & 0xf;
                    if (uVar30 == 0) {
                      iVar18 = 1;
                    }
                    else {
                      iVar18 = uVar30 + 1;
                      uVar28 = 1;
                      do {
                        if ((int)pCut0[uVar28] < 0) goto LAB_0075c0f8;
                        if ((pCut0[uVar28] ^ uVar27) < 2) {
                          iVar18 = (int)uVar28;
                          break;
                        }
                        bVar41 = uVar28 != uVar30;
                        uVar28 = uVar28 + 1;
                      } while (bVar41);
                    }
                    if ((int)uVar31 < iVar18) {
                      iVar39 = *piVar4;
                      if (iVar39 == iVar23) goto LAB_0075bd61;
                      iVar18 = iVar39 + 1;
                      *piVar4 = iVar18;
                      pJVar38->pCut[(long)iVar39 + 1] = uVar27;
                    }
                    else if (pCut0[iVar18] != uVar27) {
                      uVar34 = uVar34 | 1 << (iVar18 + 0x11U & 0x1f);
                    }
                    uVar30 = ((int)lVar36 - 1U ^ 7) << ((char)iVar18 * '\x03' - 3U & 0x1f);
                    uVar27 = uVar30 ^ uVar34;
                    lVar36 = lVar36 + 1;
                  } while (lVar36 != ((ulong)uVar14 & 0xf) + 1);
                  memcpy(pJVar38->pCut + 1,pCut0 + 1,(ulong)(uVar31 * 4));
                  if (uVar30 == uVar34) goto LAB_0075bd61;
                  uVar31 = *piVar4;
                }
                pJVar38->Sign = uVar24;
                uVar14 = Sdm_ManComputeFunc(p->pDsd,(uint)(*(ulong *)pObj >> 0x1d) & 1 ^ *pCut0 >> 8
                                            ,(uint)(*(ulong *)pObj >> 0x3d) & 1 ^ *puVar29 >> 8,
                                            piVar4,uVar27,0);
                pJVar38->iFunc = uVar14;
                if (uVar14 != 0xffffffff) {
                  if (p->pPars->fGenCnf != 0) {
                    if ((int)uVar14 < 0) goto LAB_0075c0f8;
                    if (p->vCnfs->nSize <= (int)(uVar14 >> 1)) goto LAB_0075c136;
                    if (0xb < p->vCnfs->pArray[uVar14 >> 1]) goto LAB_0075bd61;
                  }
                  uVar14 = *piVar4;
                  if ((int)uVar31 < (int)uVar14) {
                    __assert_fail("pSto[c]->pCut[0] <= nOldSupp",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                  ,0x496,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
                  }
                  if ((int)uVar14 < (int)uVar31) {
                    if ((uVar14 & 0xf) == 0) {
                      uVar26 = 0;
                    }
                    else {
                      uVar28 = 0;
                      uVar26 = 0;
                      do {
                        if (pJVar38->pCut[uVar28 + 1] < 0) goto LAB_0075c0f8;
                        uVar26 = uVar26 | 1L << ((ulong)((uint)pJVar38->pCut[uVar28 + 1] >> 1 & 0x7f
                                                        ) & 0x3f);
                        uVar28 = uVar28 + 1;
                      } while ((uVar14 & 0xf) != uVar28);
                    }
                    pJVar38->Sign = uVar26;
                  }
                  goto LAB_0075b87c;
                }
              }
            }
          }
LAB_0075bd61:
          lVar33 = lVar33 + 1;
          puVar29 = puVar29 + (ulong)(*puVar29 & 0xf) + 1;
          lVar40 = (long)(int)pwVar7[(int)uVar35];
          uVar32 = uVar26;
        } while (lVar33 < lVar40);
        uVar32 = (ulong)(uint)pwVar6[(int)uVar13];
      }
      iVar18 = (int)uVar26;
      local_6a8 = local_6a8 + 1;
      pCut0 = pCut0 + (ulong)(*pCut0 & 0xf) + 1;
    } while (local_6a8 < (int)uVar32);
    uVar16 = *(undefined8 *)pObj;
    if (((uint)uVar16 >> 0x1e & 1) != 0) {
      if (0 < iVar18) {
        uVar32 = 0;
        do {
          if (*(int *)(local_670[uVar32 + 1] + 0x18) < 3) goto LAB_0075beb3;
          uVar32 = uVar32 + 1;
        } while (uVar26 != uVar32);
      }
      goto LAB_0075be0b;
    }
  }
LAB_0075beb3:
  pJVar10 = p->pPars;
  if (((uint)uVar16 >> 0x1e & 1) == 0) {
    iVar23 = (int)uVar26;
    if (pJVar10->fCutMin == 0) {
      uVar32 = local_670[(long)iVar23 + 1];
    }
    else {
      if (0 < iVar23) {
        uVar32 = 0;
        do {
          if (*(int *)(local_670[uVar32 + 1] + 0x18) < 2) goto LAB_0075bf1a;
          uVar32 = uVar32 + 1;
        } while (uVar26 != uVar32);
      }
      uVar32 = local_670[(long)iVar23 + 1];
      *(undefined4 *)(uVar32 + 0x10) = 2;
    }
    *(undefined4 *)(uVar32 + 0x18) = 1;
    if ((int)uVar12 < 0) {
LAB_0075c263:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    *(int *)(uVar32 + 0x1c) = iVar15 * 0x55555556;
    uVar26 = (ulong)(iVar23 + 1);
  }
LAB_0075bf1a:
  if (pJVar10->fGenCnf == 0) {
    *(undefined4 *)(local_670[1] + 0x14) = 1;
  }
  else {
    if ((int)*(uint *)(local_670[1] + 0x10) < 0) {
LAB_0075c0f8:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar19 = *(uint *)(local_670[1] + 0x10) >> 1;
    if (p->vCnfs->nSize <= (int)uVar19) {
LAB_0075c136:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar23 = p->vCnfs->pArray[uVar19];
    *(int *)(local_670[1] + 0x14) = iVar23;
    if (iVar23 < 0) {
      __assert_fail("pSto[0]->Cost >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                    ,0x4c6,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
    }
  }
  fVar42 = *(float *)(local_670[1] + 8);
  if (fVar42 < 0.0) {
    __assert_fail("pSto[0]->Flow >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                  ,0x4c8,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
  }
  if ((-1 < (int)uVar12) && ((int)uVar12 < (p->vArr).nSize)) {
    uVar19 = uVar12 & 0x7fffffff;
    (p->vArr).pArray[uVar19] = *(int *)(local_670[1] + 0xc);
    if ((p->vRefs).nSize <= (int)uVar12) {
LAB_0075c117:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                    ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
    }
    if ((p->vFlow).nSize <= (int)uVar12) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                    ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
    }
    (p->vFlow).pArray[uVar19] =
         (fVar42 + (float)*(int *)(local_670[1] + 0x14 + (ulong)(fEdge != 0) * 4)) /
         (p->vRefs).pArray[uVar19];
    p_00 = p->vTemp;
    p_00->nSize = 0;
    iVar23 = (int)uVar26;
    Vec_IntPush(p_00,iVar23);
    if (0 < iVar23) {
      uVar32 = 0;
      do {
        uVar28 = local_670[uVar32 + 1];
        uVar13 = *(uint *)(uVar28 + 0x10);
        if (p->pPars->fGenCnf == 0) {
          iVar15 = 1;
        }
        else {
          if ((int)uVar13 < 0) goto LAB_0075c0f8;
          if (p->vCnfs->nSize <= (int)(uVar13 >> 1)) goto LAB_0075c136;
          iVar15 = p->vCnfs->pArray[uVar13 >> 1];
        }
        *(int *)(uVar28 + 0x14) = iVar15;
        Vec_IntPush(p->vTemp,iVar15 << 4 | uVar13 << 8 | *(uint *)(uVar28 + 0x18));
        if (0 < *(int *)(uVar28 + 0x18)) {
          lVar40 = 0;
          do {
            Vec_IntPush(p->vTemp,*(int *)(uVar28 + 0x1c + lVar40 * 4));
            lVar40 = lVar40 + 1;
          } while (lVar40 < *(int *)(uVar28 + 0x18));
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar26);
    }
    iVar15 = Vec_SetAppend(&p->pMem,p->vTemp->pArray,p->vTemp->nSize);
    if ((int)uVar12 < (p->vCuts).nSize) {
      (p->vCuts).pArray[uVar19] = iVar15;
      p->CutCount[3] = p->CutCount[3] + (long)iVar23;
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Jf_ObjComputeCuts( Jf_Man_t * p, Gia_Obj_t * pObj, int fEdge )
{
    int        LutSize = p->pPars->nLutSize;
    int        CutNum = p->pPars->nCutNum;
    int        iObj = Gia_ObjId(p->pGia, pObj);
    word       Sign0[JF_CUT_MAX+2]; // signatures of the first cut
    word       Sign1[JF_CUT_MAX+2]; // signatures of the second cut
    Jf_Cut_t   Sto[JF_CUT_MAX+2];   // cut storage
    Jf_Cut_t * pSto[JF_CUT_MAX+2];  // pointers to cut storage
    int *      pCut0, * pCut1, * pCuts0, * pCuts1;
    int        nOldSupp, Config, i, k, c = 0;
    // prepare cuts
    for ( i = 0; i <= CutNum+1; i++ )
        pSto[i] = Sto + i, pSto[i]->Cost = 0, pSto[i]->iFunc = ~0;
    // compute signatures
    pCuts0 = Jf_ObjCuts( p, Gia_ObjFaninId0(pObj, iObj) );
    Jf_ObjForEachCut( pCuts0, pCut0, i )
        Sign0[i] = Jf_CutGetSign( pCut0 );
    // compute signatures
    pCuts1 = Jf_ObjCuts( p, Gia_ObjFaninId1(pObj, iObj) );
    Jf_ObjForEachCut( pCuts1, pCut1, i )
        Sign1[i] = Jf_CutGetSign( pCut1 );
    // merge cuts
    p->CutCount[0] += pCuts0[0] * pCuts1[0];
    Jf_ObjForEachCut( pCuts0, pCut0, i )
    Jf_ObjForEachCut( pCuts1, pCut1, k )
    {
        if ( Jf_CountBits(Sign0[i] | Sign1[k]) > LutSize )
            continue;
        p->CutCount[1]++;        
        if ( !p->pPars->fCutMin )
        {
            if ( !Jf_CutMergeOrder(pCut0, pCut1, pSto[c]->pCut, LutSize) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
        }
        else if ( p->pPars->fFuncDsd )
        {
            if ( !(Config = Jf_CutMerge2(pCut0, pCut1, pSto[c]->pCut, LutSize)) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
            nOldSupp = pSto[c]->pCut[0];
            pSto[c]->iFunc = Sdm_ManComputeFunc( p->pDsd, Jf_ObjFunc0(pObj, pCut0), Jf_ObjFunc1(pObj, pCut1), pSto[c]->pCut, Config, 0 );
            if ( pSto[c]->iFunc == -1 )
                continue;
            if ( p->pPars->fGenCnf && Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[c]->iFunc)) >= 12 ) // no more than 15
                continue;
            assert( pSto[c]->pCut[0] <= nOldSupp );
            if ( pSto[c]->pCut[0] < nOldSupp )
                pSto[c]->Sign = Jf_CutGetSign( pSto[c]->pCut );
        }
        else
        {
            if ( !Jf_CutMergeOrder(pCut0, pCut1, pSto[c]->pCut, LutSize) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
            nOldSupp = pSto[c]->pCut[0];
            pSto[c]->iFunc = Jf_TtComputeForCut( p, Jf_ObjFunc0(pObj, pCut0), Jf_ObjFunc1(pObj, pCut1), pCut0, pCut1, pSto[c]->pCut );
            assert( pSto[c]->pCut[0] <= nOldSupp );
            if ( pSto[c]->pCut[0] < nOldSupp )
                pSto[c]->Sign = Jf_CutGetSign( pSto[c]->pCut );
            if ( pSto[c]->iFunc >= (1 << 24) )
                printf( "Hard limit on the number of different Boolean functions (2^23) is reached. Quitting...\n" ), exit(1);
        }
        p->CutCount[2]++;
        pSto[c]->Time = p->pPars->fAreaOnly ? 0 : Jf_CutArr(p, pSto[c]->pCut);
        pSto[c]->Flow = Jf_CutFlow(p, pSto[c]->pCut);
        c = Jf_ObjAddCutToStore( p, pSto, c, CutNum );
        assert( c <= CutNum );
    }
//    Jf_ObjPrintStore( p, pSto, c );
//    Jf_ObjCheckStore( p, pSto, c, iObj );
    // add two variable cut
    if ( !Jf_ObjIsUnit(pObj) && !Jf_ObjHasCutWithSize(pSto, c, 2) )
    {
        assert( Jf_ObjIsUnit(Gia_ObjFanin0(pObj)) && Jf_ObjIsUnit(Gia_ObjFanin1(pObj)) );
        if ( p->pPars->fCutMin ) pSto[c]->iFunc = 4;  // set function (DSD only!)
        pSto[c]->pCut[0] = 2; 
        pSto[c]->pCut[1] = Jf_ObjLit(Gia_ObjFaninId0(pObj, iObj), Gia_ObjFaninC0(pObj)); 
        pSto[c]->pCut[2] = Jf_ObjLit(Gia_ObjFaninId1(pObj, iObj), Gia_ObjFaninC1(pObj)); 
        c++;
    }
    // add elementary cut
    if ( Jf_ObjIsUnit(pObj) && !(p->pPars->fCutMin && Jf_ObjHasCutWithSize(pSto, c, 1)) )
    {
        if ( p->pPars->fCutMin ) pSto[c]->iFunc = 2;  // set function
        pSto[c]->pCut[0] = 1;
        pSto[c]->pCut[1] = Jf_ObjLit(iObj, 0);
        c++;
    }
    // reorder cuts
//    Jf_ObjSortCuts( pSto + 1, c - 1 );
//    Jf_ObjCheckPtrs( pSto, CutNum );
    // find cost of the best cut
    pSto[0]->Cost = p->pPars->fGenCnf ? Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[0]->iFunc)) : 1;
    assert( pSto[0]->Cost >= 0 );
    // save best info
    assert( pSto[0]->Flow >= 0 );
    Vec_IntWriteEntry( &p->vArr,  iObj, pSto[0]->Time );
    Vec_FltWriteEntry( &p->vFlow, iObj, (pSto[0]->Flow + (fEdge ? pSto[0]->pCut[0] : pSto[0]->Cost)) / Jf_ObjRefs(p, iObj) );
    // add cuts to storage cuts
    Vec_IntClear( p->vTemp );
    Vec_IntPush( p->vTemp, c );
    for ( i = 0; i < c; i++ )
    {
        pSto[i]->Cost = p->pPars->fGenCnf ? Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[i]->iFunc)) : 1;
        Vec_IntPush( p->vTemp, Jf_CutSetAll(pSto[i]->iFunc, pSto[i]->Cost, pSto[i]->pCut[0]) );
        for ( k = 1; k <= pSto[i]->pCut[0]; k++ )
            Vec_IntPush( p->vTemp, pSto[i]->pCut[k] );
    }
    Vec_IntWriteEntry( &p->vCuts, iObj, Vec_SetAppend(&p->pMem, Vec_IntArray(p->vTemp), Vec_IntSize(p->vTemp)) );
    p->CutCount[3] += c;
}